

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_tcp.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  char local_98 [8];
  char uri [128];
  
  plan(0xb);
  memset(local_98,0,0x80);
  pcVar2 = getenv("LISTEN");
  snprintf(local_98,0x80,"test:test@%s",pcVar2);
  test_connect_tcp(local_98);
  test_object();
  test_request_01(local_98);
  test_request_02(local_98);
  test_request_03(local_98);
  test_request_04(local_98);
  test_request_05(local_98);
  test_msgpack_array_iter();
  test_msgpack_mapa_iter();
  test_pushes(local_98);
  test_object_format_uint(local_98);
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int main() {
	plan(11);

	char uri[128] = {0};
	snprintf(uri, 128, "test:test@%s", getenv("LISTEN"));

	test_connect_tcp(uri);
	test_object();
	test_request_01(uri);
	test_request_02(uri);
	test_request_03(uri);
	test_request_04(uri);
	test_request_05(uri);
	test_msgpack_array_iter();
	test_msgpack_mapa_iter();
	test_pushes(uri);
	test_object_format_uint(uri);

	return check_plan();
}